

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gles2::Performance::InvalidShaderCompilerLoopCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerLoopCase *this,
          int measurementNdx)

{
  InvalidityType IVar1;
  deUint32 cacheAvoidanceID;
  int in_R9D;
  ShaderValidity validity;
  string sStack_68;
  string local_48;
  
  cacheAvoidanceID =
       InvalidShaderCompilerCase::getSpecializationID
                 (&this->super_InvalidShaderCompilerCase,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  IVar1 = (this->super_InvalidShaderCompilerCase).m_invalidityType;
  validity = SHADER_VALIDITY_INVALID_CHAR;
  if (IVar1 != INVALIDITY_INVALID_CHAR) {
    validity = IVar1 == INVALIDITY_SEMANTIC_ERROR ^ SHADER_VALIDITY_LAST;
  }
  loopVertexTemplate_abi_cxx11_
            (&sStack_68,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource(&local_48,&sStack_68,cacheAvoidanceID,validity);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  loopFragmentTemplate_abi_cxx11_
            (&sStack_68,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource(&local_48,&sStack_68,cacheAvoidanceID,validity);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerLoopCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	result.vertShaderSource = specializeShaderSource(loopVertexTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, shaderValidity);
	result.fragShaderSource = specializeShaderSource(loopFragmentTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, shaderValidity);

	return result;
}